

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmcmd.cxx
# Opt level: O3

int cmcmd::HashSumFile(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *args,Algo algo)

{
  char *__s;
  bool bVar1;
  pointer pbVar2;
  size_t sVar3;
  ostream *poVar4;
  long lVar5;
  ulong uVar6;
  string value;
  int local_84;
  allocator local_7d;
  Algo local_7c;
  string local_78;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_58;
  string local_50;
  
  pbVar2 = (args->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  local_84 = -1;
  if (0x40 < (ulong)((long)(args->
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar2)) {
    local_84 = 0;
    uVar6 = 2;
    lVar5 = 0x40;
    local_7c = algo;
    local_58 = args;
    do {
      __s = *(char **)((long)&(pbVar2->_M_dataplus)._M_p + lVar5);
      std::__cxx11::string::string((string *)&local_78,__s,(allocator *)&local_50);
      bVar1 = cmsys::SystemTools::FileIsDirectory(&local_78);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_78._M_dataplus._M_p != &local_78.field_2) {
        operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
      }
      if (bVar1) {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error: ",7);
        if (__s == (char *)0x0) {
          std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x69c268);
        }
        else {
          sVar3 = strlen(__s);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,__s,sVar3);
        }
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr," is a directory",0xf);
        std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + 'h');
        std::ostream::put('h');
        std::ostream::flush();
        local_84 = local_84 + 1;
      }
      else {
        std::__cxx11::string::string((string *)&local_50,__s,&local_7d);
        cmSystemTools::ComputeFileHash(&local_78,&local_50,local_7c);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_dataplus._M_p != &local_50.field_2) {
          operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
        }
        if (local_78._M_string_length == 0) {
          if (__s == (char *)0x0) {
            std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x69c268);
          }
          else {
            sVar3 = strlen(__s);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,__s,sVar3);
          }
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cerr,": No such file or directory",0x1b);
          std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + 'h');
          std::ostream::put('h');
          std::ostream::flush();
          local_84 = local_84 + 1;
        }
        else {
          poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)&std::cout,local_78._M_dataplus._M_p,
                              local_78._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar4,"  ",2);
          if (__s == (char *)0x0) {
            std::ios::clear((int)poVar4 + (int)poVar4->_vptr_basic_ostream[-3]);
          }
          else {
            sVar3 = strlen(__s);
            std::__ostream_insert<char,std::char_traits<char>>(poVar4,__s,sVar3);
          }
          std::ios::widen((char)poVar4->_vptr_basic_ostream[-3] + (char)poVar4);
          std::ostream::put((char)poVar4);
          std::ostream::flush();
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_78._M_dataplus._M_p != &local_78.field_2) {
          operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
        }
      }
      uVar6 = uVar6 + 1;
      pbVar2 = (local_58->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      lVar5 = lVar5 + 0x20;
    } while (uVar6 < (ulong)((long)(local_58->
                                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar2 >> 5))
    ;
  }
  return local_84;
}

Assistant:

int cmcmd::HashSumFile(std::vector<std::string>& args, cmCryptoHash::Algo algo)
{
  if (args.size() < 3) {
    return -1;
  }
  int retval = 0;

  for (std::string::size_type cc = 2; cc < args.size(); cc++) {
    const char* filename = args[cc].c_str();
    // Cannot compute sum of a directory
    if (cmSystemTools::FileIsDirectory(filename)) {
      std::cerr << "Error: " << filename << " is a directory" << std::endl;
      retval++;
    } else {
      std::string value = cmSystemTools::ComputeFileHash(filename, algo);
      if (value.empty()) {
        // To mimic "md5sum/shasum" behavior in a shell:
        std::cerr << filename << ": No such file or directory" << std::endl;
        retval++;
      } else {
        std::cout << value << "  " << filename << std::endl;
      }
    }
  }
  return retval;
}